

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

void __thiscall Am_Value_List::Set(Am_Value_List *this,Am_String *value,bool unique)

{
  Am_Value_List_Data *pAVar1;
  Am_List_Item *pAVar2;
  int iVar3;
  undefined4 extraout_var;
  Am_List_Item *pAVar4;
  Am_List_Item **ppAVar5;
  Am_Value store;
  Am_Value local_20;
  
  pAVar1 = this->data;
  if ((pAVar1 != (Am_Value_List_Data *)0x0 && unique) && ((pAVar1->super_Am_Wrapper).refs != 1)) {
    iVar3 = (*(pAVar1->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
    pAVar4 = this->item;
    if (pAVar4 != (Am_List_Item *)0x0) {
      ppAVar5 = &((Am_Value_List_Data *)CONCAT44(extraout_var,iVar3))->head;
      do {
        pAVar4 = pAVar4->prev;
        pAVar2 = *ppAVar5;
        ppAVar5 = &pAVar2->next;
      } while (pAVar4 != (Am_List_Item *)0x0);
      this->item = pAVar2;
    }
    this->data = (Am_Value_List_Data *)CONCAT44(extraout_var,iVar3);
  }
  Am_Value::Am_Value(&local_20,value);
  if (this->item != (Am_List_Item *)0x0) {
    Am_Value::operator=(&this->item->super_Am_Value,&local_20);
    Am_Value::~Am_Value(&local_20);
    return;
  }
  Am_Error("Set called while no item is current\n");
}

Assistant:

void Am_Value_List::Set(const Am_Value &value, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  }
  data->Set(value, item);
}